

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue.h
# Opt level: O0

iterator * __thiscall
bidfx_public_api::tools::BlockingQueue<bidfx_public_api::price::pixie::AckData>::Pop
          (iterator *__return_storage_ptr__,
          BlockingQueue<bidfx_public_api::price::pixie::AckData> *this)

{
  bool bVar1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  BlockingQueue<bidfx_public_api::price::pixie::AckData> *this_local;
  iterator *element;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex_);
  bVar1 = std::
          deque<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
          ::empty(&this->queue_);
  if (bVar1) {
    std::
    deque<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
    ::end(__return_storage_ptr__,&this->queue_);
  }
  else {
    std::
    deque<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
    ::begin(__return_storage_ptr__,&this->queue_);
    std::
    deque<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
    ::pop_front(&this->queue_);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<T>::iterator Pop()
    {
        std::unique_lock<std::mutex> lock(mutex_);

        if (queue_.empty())
        {
            return queue_.end();
        }

        auto element = queue_.begin();
        queue_.pop_front();
        return element;
    }